

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O0

int ep_speech_count(ps_endpointer_t *ep)

{
  int iVar1;
  int local_1c;
  int end;
  int i_1;
  int i;
  int count;
  ps_endpointer_t *ep_local;
  
  i_1 = 0;
  iVar1 = ep_empty(ep);
  if (iVar1 == 0) {
    iVar1 = ep_full(ep);
    if (iVar1 == 0) {
      i_1 = (int)ep->is_speech[ep->pos];
      for (local_1c = ep->pos + 1; local_1c != (ep->pos + ep->n) % ep->maxlen;
          local_1c = (local_1c + 1) % ep->maxlen) {
        i_1 = ep->is_speech[local_1c] + i_1;
      }
    }
    else {
      for (end = 0; end < ep->maxlen; end = end + 1) {
        i_1 = ep->is_speech[end] + i_1;
      }
    }
  }
  return i_1;
}

Assistant:

static int
ep_speech_count(ps_endpointer_t *ep)
{
    int count = 0;
    if (ep_empty(ep))
        ;
    else if (ep_full(ep)) {
        int i;
        for (i = 0; i < ep->maxlen; ++i)
            count += ep->is_speech[i];
    }
    else {
        int i = ep->pos, end = (ep->pos + ep->n) % ep->maxlen;
        count = ep->is_speech[i++];
        while (i != end) {
            count += ep->is_speech[i++];
            i = i % ep->maxlen;
        }
    }
    return count;
}